

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O0

void __thiscall
oout::dirty::Test::Test<std::shared_ptr<oout::NamedTest_const>>
          (Test *this,string *name,shared_ptr<const_oout::NamedTest> *tests)

{
  undefined1 local_40 [16];
  shared_ptr<const_oout::Test> local_30;
  shared_ptr<const_oout::NamedTest> *local_20;
  shared_ptr<const_oout::NamedTest> *tests_local;
  string *name_local;
  Test *this_local;
  
  local_20 = tests;
  tests_local = (shared_ptr<const_oout::NamedTest> *)name;
  name_local = (string *)this;
  std::
  make_shared<oout::NamedTest,std::__cxx11::string_const&,std::shared_ptr<oout::NamedTest_const>const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (shared_ptr<const_oout::NamedTest> *)name);
  std::shared_ptr<oout::Test_const>::shared_ptr<oout::NamedTest,void>
            ((shared_ptr<oout::Test_const> *)&local_30,(shared_ptr<oout::NamedTest> *)local_40);
  Test(this,&local_30);
  std::shared_ptr<const_oout::Test>::~shared_ptr(&local_30);
  std::shared_ptr<oout::NamedTest>::~shared_ptr((shared_ptr<oout::NamedTest> *)local_40);
  return;
}

Assistant:

Test(
		const std::string &name,
		const T & ... tests
	) : Test(std::make_shared<oout::NamedTest>(name, tests...))
	{
	}